

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v7::detail::
    get_dynamic_spec<fmt::v7::detail::precision_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>,fmt::v7::detail::error_handler>
              (void)

{
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> custom;
  ulong uVar1;
  int value_02;
  type tVar2;
  byte bStack0000000000000008;
  undefined4 uStack000000000000000c;
  undefined2 arg;
  undefined6 uStack0000000000000012;
  undefined4 in_stack_00000018;
  unkbyte10 in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff32;
  precision_checker<fmt::v7::detail::error_handler> local_90;
  ulong local_88;
  unsigned_long_long value;
  undefined8 local_78;
  undefined8 local_70;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_68;
  basic_string_view<char> local_58;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 *local_20;
  precision_checker<fmt::v7::detail::error_handler> *local_18;
  ulong local_10;
  
  precision_checker<fmt::v7::detail::error_handler>::precision_checker
            (&local_90,(error_handler *)((long)&value + 7));
  local_20 = (undefined8 *)&stack0x00000008;
  local_18 = &local_90;
  switch(in_stack_00000018) {
  case 0:
  default:
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<fmt::v7::monostate,_0>
                         (&local_90);
    break;
  case 1:
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<int,_0>
                         (&local_90,(int)_bStack0000000000000008);
    break;
  case 2:
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<unsigned_int,_0>
                         (&local_90,(uint)_bStack0000000000000008);
    break;
  case 3:
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<long_long,_0>
                         (&local_90,CONCAT44(uStack000000000000000c,_bStack0000000000000008));
    break;
  case 4:
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<unsigned_long_long,_0>
                         (&local_90,CONCAT44(uStack000000000000000c,_bStack0000000000000008));
    break;
  case 5:
    local_38 = CONCAT44(uStack000000000000000c,_bStack0000000000000008);
    local_30 = CONCAT62(uStack0000000000000012,arg);
    value_00._10_6_ = in_stack_ffffffffffffff32;
    value_00._0_10_ = in_stack_ffffffffffffff28;
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<__int128,_0>
                         (&local_90,(__int128)value_00);
    break;
  case 6:
    local_48 = CONCAT44(uStack000000000000000c,_bStack0000000000000008);
    local_40 = CONCAT62(uStack0000000000000012,arg);
    value_01._10_6_ = in_stack_ffffffffffffff32;
    value_01._0_10_ = in_stack_ffffffffffffff28;
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<unsigned___int128,_0>
                         (&local_90,(unsigned___int128)value_01);
    break;
  case 7:
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<bool,_0>
                         (&local_90,(bool)(bStack0000000000000008 & 1));
    break;
  case 8:
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<char,_0>
                         (&local_90,bStack0000000000000008);
    break;
  case 9:
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<float,_0>
                         (&local_90,_bStack0000000000000008);
    break;
  case 10:
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<double,_0>
                         (&local_90,(double)CONCAT44(uStack000000000000000c,_bStack0000000000000008)
                         );
    break;
  case 0xb:
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<long_double,_0>
                         (&local_90,
                          (longdouble)
                          CONCAT28(arg,CONCAT44(uStack000000000000000c,_bStack0000000000000008)));
    break;
  case 0xc:
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<const_char_*,_0>
                         (&local_90,(char *)CONCAT44(uStack000000000000000c,_bStack0000000000000008)
                         );
    break;
  case 0xd:
    basic_string_view<char>::basic_string_view
              (&local_58,(char *)CONCAT44(uStack000000000000000c,_bStack0000000000000008),
               CONCAT62(uStack0000000000000012,arg));
    local_10 = precision_checker<fmt::v7::detail::error_handler>::
               operator()<fmt::v7::basic_string_view<char>,_0>(&local_90,local_58);
    break;
  case 0xe:
    local_10 = precision_checker<fmt::v7::detail::error_handler>::operator()<const_void_*,_0>
                         (&local_90,(void *)CONCAT44(uStack000000000000000c,_bStack0000000000000008)
                         );
    break;
  case 0xf:
    local_78 = CONCAT44(uStack000000000000000c,_bStack0000000000000008);
    local_70 = CONCAT62(uStack0000000000000012,arg);
    custom.value._4_4_ = uStack000000000000000c;
    custom.value._0_4_ = _bStack0000000000000008;
    custom.format._0_2_ = arg;
    custom.format._2_6_ = uStack0000000000000012;
    basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
    handle::handle((handle *)&local_68,custom);
    local_10 = precision_checker<fmt::v7::detail::error_handler>::
               operator()<fmt::v7::basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::handle,_0>
                         (&local_90,(handle)local_68);
  }
  uVar1 = local_10;
  local_88 = local_10;
  value_02 = max_value<int>();
  tVar2 = to_unsigned<int>(value_02);
  if (uVar1 <= tVar2) {
    return (int)local_88;
  }
  error_handler::on_error((error_handler *)((long)&value + 7),"number is too big");
}

Assistant:

FMT_CONSTEXPR int get_dynamic_spec(FormatArg arg, ErrorHandler eh) {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}